

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua_sjasm.cpp
# Opt level: O1

bool lua_zx_trdimage_create(char *trdname,char *label)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  char l8 [9];
  undefined8 uStack_60;
  char local_58 [16];
  char *local_48;
  path local_40;
  
  builtin_strncpy(local_58,"        ",9);
  if ((label != (char *)0x0) && (cVar1 = *label, cVar1 != '\0')) {
    lVar4 = 1;
    do {
      *(char *)((long)&uStack_60 + lVar4 + 7) = cVar1;
      cVar1 = label[lVar4];
      if (cVar1 == '\0') break;
      bVar2 = lVar4 < 8;
      lVar4 = lVar4 + 1;
    } while (bVar2);
  }
  uStack_60 = 0x11d4d4;
  iVar3 = addLuaSourcePositions();
  local_48 = "";
  if (trdname != (char *)0x0) {
    local_48 = trdname;
  }
  uStack_60 = 0x11d4fe;
  std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
            (&local_40,&local_48,auto_format);
  uStack_60 = 0x11d509;
  bVar2 = TRD_SaveEmpty(&local_40,local_58);
  uStack_60 = 0x11d515;
  std::filesystem::__cxx11::path::~path(&local_40);
  if (iVar3 != 0) {
    sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
    super__Vector_impl_data._M_finish =
         sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
         super__Vector_impl_data._M_finish + (-1 - (ulong)(iVar3 - 1));
  }
  return bVar2;
}

Assistant:

static bool lua_zx_trdimage_create(const char* trdname, const char* label = nullptr) {
	// setup label to truncated 8 char array padded with spaces
	char l8[9] = "        ";
	char* l8_ptr = l8;
	while (label && *label && (l8_ptr - l8) < 8) *l8_ptr++ = *label++;
	int positionsAdded = addLuaSourcePositions();	// add known script positions to sourcePosStack vector
	bool result = TRD_SaveEmpty(trdname ? trdname : "", l8);
	removeLuaSourcePositions(positionsAdded);
	return result;
}